

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O0

ostream * operator<<(ostream *out,BigInteger *a)

{
  ostream *poVar1;
  ostream *in_RDI;
  BigInteger *in_stack_00000058;
  string local_30 [48];
  
  BigInteger::toString_abi_cxx11_(in_stack_00000058);
  poVar1 = std::operator<<(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const BigInteger &a)
{
    return out << a.toString();
}